

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  clock_t cVar4;
  clock_t cVar5;
  long in_RSI;
  int in_EDI;
  int timeEnd;
  int timeBegin;
  size_t i_4;
  size_t i_3;
  bool found;
  char *p;
  char *rest;
  char *opt;
  size_t i_2;
  size_t i_1;
  size_t i;
  char *arg;
  int argnb;
  char *hashToTest;
  char *defaulthash;
  ulong local_78;
  ulong local_70;
  char *local_58;
  char *in_stack_ffffffffffffffb0;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  int local_24;
  
  if (in_EDI < 2) {
    printf("No test hash given on command line, testing %s.\n","xxh3");
    printf(
          "Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n       [--test=Speed,...] hash\n"
          );
  }
  local_24 = 1;
  do {
    if (in_EDI <= local_24) {
      cVar4 = clock();
      testHash(in_stack_ffffffffffffffb0);
      cVar5 = clock();
      printf("\n");
      fflush((FILE *)0x0);
      if ((g_testAll & 1U) == 0) {
        fprintf(_stderr,"Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n",
                (ulong)g_inputVCode,(ulong)g_outputVCode,(ulong)g_resultVCode);
        fprintf(_stderr,"Verification value is 0x%08x - Testing took %f seconds\n",
                (double)((int)cVar5 - (int)cVar4) / 1000000.0,(ulong)g_verify);
      }
      else {
        printf("Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n",(ulong)g_inputVCode,
               (ulong)g_outputVCode,(ulong)g_resultVCode);
        printf("Verification value is 0x%08x - Testing took %f seconds\n",
               (double)((int)cVar5 - (int)cVar4) / 1000000.0,(ulong)g_verify);
        printf("-------------------------------------------------------------------------------\n");
      }
      fflush((FILE *)0x0);
      return 0;
    }
    local_58 = *(char **)(in_RSI + (long)local_24 * 8);
    iVar2 = strncmp(local_58,"--",2);
    if (iVar2 == 0) {
      iVar2 = strcmp(local_58,"--help");
      if (iVar2 == 0) {
        printf(
              "Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n       [--test=Speed,...] hash\n"
              );
        exit(0);
      }
      iVar2 = strcmp(local_58,"--list");
      if (iVar2 == 0) {
        for (local_38 = 0; local_38 < 0x96; local_38 = local_38 + 1) {
          printf("%-16s\t\"%s\" %s\n",g_hashes[local_38].name,g_hashes[local_38].desc,
                 quality_str[g_hashes[local_38].quality]);
        }
        exit(0);
      }
      iVar2 = strcmp(local_58,"--listnames");
      if (iVar2 == 0) {
        for (local_40 = 0; local_40 < 0x96; local_40 = local_40 + 1) {
          printf("%s\n",g_hashes[local_40].name);
        }
        exit(0);
      }
      iVar2 = strcmp(local_58,"--tests");
      if (iVar2 == 0) {
        printf("Valid tests:\n");
        for (local_48 = 0; local_48 < 0x14; local_48 = local_48 + 1) {
          printf("  %s\n",g_testopts[local_48].name);
        }
        exit(0);
      }
      iVar2 = strcmp(local_58,"--verbose");
      if (iVar2 == 0) {
        g_drawDiagram = true;
      }
      else {
        iVar2 = strcmp(local_58,"--extra");
        if (iVar2 == 0) {
          g_testExtra = true;
        }
        else {
          iVar2 = strncmp(local_58,"--test=",6);
          if (iVar2 != 0) {
            printf("Invalid command \n");
            printf(
                  "Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n       [--test=Speed,...] hash\n"
                  );
            exit(1);
          }
          local_58 = local_58 + 7;
          bVar1 = false;
          g_testAll = false;
          do {
            pcVar3 = strchr(local_58,0x2c);
            in_stack_ffffffffffffffb0 = local_58;
            if (pcVar3 != (char *)0x0) {
              in_stack_ffffffffffffffb0 = strndup(local_58,(long)pcVar3 - (long)local_58);
              local_58 = pcVar3 + 1;
            }
            for (local_70 = 0; local_70 < 0x14; local_70 = local_70 + 1) {
              iVar2 = strcmp(in_stack_ffffffffffffffb0,g_testopts[local_70].name);
              if (iVar2 == 0) {
                *g_testopts[local_70].var = true;
                bVar1 = true;
                break;
              }
            }
            if (!bVar1) {
              printf("Invalid option: --test=%s\n",in_stack_ffffffffffffffb0);
              printf("Valid tests: --test=%s",g_testopts[0].name);
              for (local_78 = 1; local_78 < 0x14; local_78 = local_78 + 1) {
                printf(",%s",g_testopts[local_78].name);
              }
              printf(" \n");
              exit(1);
            }
          } while (pcVar3 != (char *)0x0);
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int main ( int argc, const char ** argv )
{
#ifdef DEBUG
  const char * defaulthash = "wysha";
#elif defined(__x86_64__) || defined(_M_X64) || defined(_X86_64_)
  const char * defaulthash = "xxh3";
#else
  const char * defaulthash = "wyhash";
#endif
  const char * hashToTest = defaulthash;

  if (argc < 2) {
    printf("No test hash given on command line, testing %s.\n", hashToTest);
    printf("Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n"
           "       [--test=Speed,...] hash\n");
  }

  for (int argnb = 1; argnb < argc; argnb++) {
    const char* const arg = argv[argnb];
    if (strncmp(arg,"--", 2) == 0) {
      // This is a command
      if (strcmp(arg,"--help") == 0) {
        printf("Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n"
               "       [--test=Speed,...] hash\n");
        exit(0);
      }
      if (strcmp(arg,"--list") == 0) {
        for(size_t i = 0; i < sizeof(g_hashes) / sizeof(HashInfo); i++) {
          printf("%-16s\t\"%s\" %s\n", g_hashes[i].name, g_hashes[i].desc, quality_str[g_hashes[i].quality]);
        }
        exit(0);
      }
      if (strcmp(arg,"--listnames") == 0) {
        for(size_t i = 0; i < sizeof(g_hashes) / sizeof(HashInfo); i++) {
          printf("%s\n", g_hashes[i].name);
        }
        exit(0);
      }
      if (strcmp(arg,"--tests") == 0) {
        printf("Valid tests:\n");
        for(size_t i = 0; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
          printf("  %s\n", g_testopts[i].name);
        }
        exit(0);
      }
      if (strcmp(arg,"--verbose") == 0) {
        g_drawDiagram = true;
        continue;
      }
      if (strcmp(arg,"--extra") == 0) {
        g_testExtra = true;
        continue;
      }
      /* default: --test=All. comma seperated list of options */
      if (strncmp(arg,"--test=", 6) == 0) {
        char *opt = (char *)&arg[7];
        char *rest = opt;
        char *p;
        bool found = false;
        g_testAll = false;
        do {
          if ((p = strchr(rest, ','))) {
            opt = strndup(rest, p-rest);
            rest = p+1;
          } else {
            opt = rest;
          }
          for (size_t i = 0; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
            if (strcmp(opt, g_testopts[i].name) == 0) {
              g_testopts[i].var = true; found = true; break;
            }
          }
          if (!found) {
            printf("Invalid option: --test=%s\n", opt);
            printf("Valid tests: --test=%s", g_testopts[0].name);
            for(size_t i = 1; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
              printf(",%s", g_testopts[i].name);
            }
            printf(" \n");
            exit(1);
          }
        } while (p);
        continue;
      }
      // invalid command
      printf("Invalid command \n");
      printf("Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n"
             "       [--test=Speed,...] hash\n");
      exit(1);
    }
    // Not a command ? => interprested as hash name
    hashToTest = arg;
  }

  // Code runs on the 3rd CPU by default? only for speed tests
  //SetAffinity((1 << 2));
  //SelfTest();

  int timeBegin = clock();

  testHash(hashToTest);

  int timeEnd = clock();

  printf("\n");
  fflush(NULL);
  if (g_testAll) {
    printf("Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n", g_inputVCode, g_outputVCode, g_resultVCode);
    printf("Verification value is 0x%08x - Testing took %f seconds\n", g_verify, double(timeEnd-timeBegin)/double(CLOCKS_PER_SEC));
    printf("-------------------------------------------------------------------------------\n");
  } else {
    fprintf(stderr, "Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n", g_inputVCode, g_outputVCode, g_resultVCode);
    fprintf(stderr, "Verification value is 0x%08x - Testing took %f seconds\n", g_verify, double(timeEnd-timeBegin)/double(CLOCKS_PER_SEC));
  }
    fflush(NULL);
  return 0;
}